

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void rw::hanimInterpCB(void *vout,void *vin1,void *vin2,float32 t,void *param_5)

{
  float r;
  V3d VVar1;
  Quat QVar2;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_60;
  float32 a;
  HAnimKeyFrame *in2;
  HAnimKeyFrame *in1;
  HAnimInterpFrame *out;
  void *param_4_local;
  float32 t_local;
  void *vin2_local;
  void *vin1_local;
  void *vout_local;
  
  r = ((float)t - *(float *)((long)vin1 + 8)) /
      (*(float *)((long)vin2 + 8) - *(float *)((long)vin1 + 8));
  VVar1 = lerp((V3d *)((long)vin1 + 0x1c),(V3d *)((long)vin2 + 0x1c),(float32)r);
  local_60 = VVar1.z;
  local_68 = VVar1._0_8_;
  *(float32 *)((long)vout + 0x28) = local_60;
  *(undefined8 *)((long)vout + 0x20) = local_68;
  QVar2 = slerp((Quat *)((long)vin1 + 0xc),(Quat *)((long)vin2 + 0xc),(float32)r);
  local_78 = QVar2._0_8_;
  *(undefined8 *)((long)vout + 0x10) = local_78;
  local_70 = QVar2._8_8_;
  *(undefined8 *)((long)vout + 0x18) = local_70;
  return;
}

Assistant:

static void
hanimInterpCB(void *vout, void *vin1, void *vin2, float32 t, void*)
{
	HAnimInterpFrame *out = (HAnimInterpFrame*)vout;
	HAnimKeyFrame *in1 = (HAnimKeyFrame*)vin1;
	HAnimKeyFrame *in2 = (HAnimKeyFrame*)vin2;
assert(t >= in1->time && t <= in2->time);
	float32 a = (t - in1->time)/(in2->time - in1->time);
	out->t =  lerp(in1->t, in2->t, a);
	out->q = slerp(in1->q, in2->q, a);
}